

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O1

void * __thiscall
density_tests::DeepTestAllocator<256UL>::allocate
          (DeepTestAllocator<256UL> *this,size_t i_size,size_t i_alignment,size_t i_alignment_offset
          )

{
  pointer ppIVar1;
  void *i_block;
  pointer ppIVar2;
  
  exception_checkpoint();
  i_block = density::basic_default_allocator<256UL>::allocate
                      ((basic_default_allocator<256UL> *)this,i_size,i_alignment,i_alignment_offset)
  ;
  SharedBlockRegistry::register_block
            (&this->m_registry,2,i_block,i_size,i_alignment,i_alignment_offset);
  ppIVar1 = (this->m_hooks).
            super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->m_hooks).
                 super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    (**(code **)(*(long *)*ppIVar2 + 0x10))(*ppIVar2,i_block,i_size,i_alignment,i_alignment_offset);
  }
  return i_block;
}

Assistant:

void * allocate(size_t i_size, size_t i_alignment, size_t i_alignment_offset = 0)
        {
            exception_checkpoint();

            auto block = Base::allocate(i_size, i_alignment, i_alignment_offset);
            m_registry.register_block(
              s_default_category, block, i_size, i_alignment, i_alignment_offset);
            invoke_hook(
              &IAllocatorHook::on_allocated_block, block, i_size, i_alignment, i_alignment_offset);
            return block;
        }